

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_ulong mz_crc32(mz_ulong crc,mz_uint8 *ptr,size_t buf_len)

{
  size_t sVar1;
  uint uVar2;
  
  if (ptr != (mz_uint8 *)0x0) {
    if (buf_len != 0) {
      uVar2 = ~(uint)crc;
      sVar1 = 0;
      do {
        uVar2 = uVar2 >> 4 ^ mz_crc32::s_crc32[(uVar2 ^ ptr[sVar1]) & 0xf];
        uVar2 = uVar2 >> 4 ^ mz_crc32::s_crc32[(uint)(ptr[sVar1] >> 4) ^ uVar2 & 0xf];
        sVar1 = sVar1 + 1;
      } while (buf_len != sVar1);
      crc = (mz_ulong)~uVar2;
    }
    return crc & 0xffffffff;
  }
  return 0;
}

Assistant:

mz_ulong mz_crc32(mz_ulong crc, const mz_uint8 *ptr, size_t buf_len)
{
  static const mz_uint32 s_crc32[16] = { 0, 0x1db71064, 0x3b6e20c8, 0x26d930ac, 0x76dc4190, 0x6b6b51f4, 0x4db26158, 0x5005713c,
    0xedb88320, 0xf00f9344, 0xd6d6a3e8, 0xcb61b38c, 0x9b64c2b0, 0x86d3d2d4, 0xa00ae278, 0xbdbdf21c };
  mz_uint32 crcu32 = (mz_uint32)crc;
  if (!ptr) return MZ_CRC32_INIT;
  crcu32 = ~crcu32; while (buf_len--) { mz_uint8 b = *ptr++; crcu32 = (crcu32 >> 4) ^ s_crc32[(crcu32 & 0xF) ^ (b & 0xF)]; crcu32 = (crcu32 >> 4) ^ s_crc32[(crcu32 & 0xF) ^ (b >> 4)]; }
  return ~crcu32;
}